

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_semantic_analysis.cpp
# Opt level: O3

compile_errcode __thiscall ConditionStatement::Action(ConditionStatement *this)

{
  SymbolName SVar1;
  int iVar2;
  compile_errcode cVar3;
  Statement *pSVar4;
  pointer pcVar5;
  undefined8 uVar6;
  
  pSVar4 = (Statement *)operator_new(0x1e8);
  (pSVar4->super_AnalysisInterface)._vptr_AnalysisInterface = (_func_int **)&PTR_Parse_00172618;
  (pSVar4->m_output_statement).super_AnalysisInterface._vptr_AnalysisInterface =
       (_func_int **)&PTR_Parse_00172510;
  (pSVar4->m_output_statement).m_expression.super_AnalysisInterface._vptr_AnalysisInterface =
       (_func_int **)&PTR_Parse_001721f8;
  (pSVar4->m_output_statement).m_expression.m_term.super_AnalysisInterface._vptr_AnalysisInterface =
       (_func_int **)&PTR_Parse_00172250;
  (pSVar4->m_input_statement).super_AnalysisInterface._vptr_AnalysisInterface =
       (_func_int **)&PTR_Parse_00172460;
  (pSVar4->m_return_statement).super_AnalysisInterface._vptr_AnalysisInterface =
       (_func_int **)&PTR_Parse_001724b8;
  (pSVar4->m_return_statement).m_expression.super_AnalysisInterface._vptr_AnalysisInterface =
       (_func_int **)&PTR_Parse_001721f8;
  (pSVar4->m_return_statement).m_expression.m_term.super_AnalysisInterface._vptr_AnalysisInterface =
       (_func_int **)&PTR_Parse_00172250;
  (pSVar4->m_assign_statement).super_AnalysisInterface._vptr_AnalysisInterface =
       (_func_int **)&PTR_Parse_00172568;
  (pSVar4->m_assign_statement).m_expression.super_AnalysisInterface._vptr_AnalysisInterface =
       (_func_int **)&PTR_Parse_001721f8;
  (pSVar4->m_assign_statement).m_expression.m_term.super_AnalysisInterface._vptr_AnalysisInterface =
       (_func_int **)&PTR_Parse_00172250;
  (pSVar4->m_assign_statement).m_identifier_name._M_dataplus._M_p =
       (pointer)&(pSVar4->m_assign_statement).m_identifier_name.field_2;
  uVar6 = 0;
  (pSVar4->m_assign_statement).m_identifier_name._M_string_length = 0;
  (pSVar4->m_assign_statement).m_identifier_name.field_2._M_local_buf[0] = '\0';
  (pSVar4->m_function_call).super_AnalysisInterface._vptr_AnalysisInterface =
       (_func_int **)&PTR_Parse_00172670;
  (pSVar4->m_function_call).m_value_argument_list.super_AnalysisInterface._vptr_AnalysisInterface =
       (_func_int **)&PTR_Parse_001722a8;
  (pSVar4->m_function_call).m_value_argument_list.m_expression.super_AnalysisInterface.
  _vptr_AnalysisInterface = (_func_int **)&PTR_Parse_001721f8;
  (pSVar4->m_function_call).m_value_argument_list.m_expression.m_term.super_AnalysisInterface.
  _vptr_AnalysisInterface = (_func_int **)&PTR_Parse_00172250;
  (pSVar4->m_condition_statement).super_AnalysisInterface._vptr_AnalysisInterface =
       (_func_int **)&PTR_Parse_001726c8;
  (pSVar4->m_condition_statement).m_condition.super_AnalysisInterface._vptr_AnalysisInterface =
       (_func_int **)&PTR_Parse_001725c0;
  (pSVar4->m_condition_statement).m_condition.m_expression.super_AnalysisInterface.
  _vptr_AnalysisInterface = (_func_int **)&PTR_Parse_001721f8;
  (pSVar4->m_condition_statement).m_condition.m_expression.m_term.super_AnalysisInterface.
  _vptr_AnalysisInterface = (_func_int **)&PTR_Parse_00172250;
  (pSVar4->m_condition_statement).m_bottom_label._M_dataplus._M_p =
       (pointer)&(pSVar4->m_condition_statement).m_bottom_label.field_2;
  (pSVar4->m_condition_statement).m_bottom_label._M_string_length = 0;
  (pSVar4->m_condition_statement).m_bottom_label.field_2._M_local_buf[0] = '\0';
  (pSVar4->m_while_loop_statement).super_AnalysisInterface._vptr_AnalysisInterface =
       (_func_int **)&PTR_Parse_00172720;
  (pSVar4->m_while_loop_statement).m_condition.super_AnalysisInterface._vptr_AnalysisInterface =
       (_func_int **)&PTR_Parse_001725c0;
  (pSVar4->m_while_loop_statement).m_condition.m_expression.super_AnalysisInterface.
  _vptr_AnalysisInterface = (_func_int **)&PTR_Parse_001721f8;
  (pSVar4->m_while_loop_statement).m_condition.m_expression.m_term.super_AnalysisInterface.
  _vptr_AnalysisInterface = (_func_int **)&PTR_Parse_00172250;
  (pSVar4->m_while_loop_statement).m_top_label._M_dataplus._M_p =
       (pointer)&(pSVar4->m_while_loop_statement).m_top_label.field_2;
  (pSVar4->m_while_loop_statement).m_top_label._M_string_length = 0;
  (pSVar4->m_while_loop_statement).m_top_label.field_2._M_local_buf[0] = '\0';
  (pSVar4->m_while_loop_statement).m_bottom_label._M_dataplus._M_p =
       (pointer)&(pSVar4->m_while_loop_statement).m_bottom_label.field_2;
  (pSVar4->m_while_loop_statement).m_bottom_label._M_string_length = 0;
  (pSVar4->m_while_loop_statement).m_bottom_label.field_2._M_local_buf[0] = '\0';
  (pSVar4->m_switch_statement).super_AnalysisInterface._vptr_AnalysisInterface =
       (_func_int **)&PTR_Parse_00172778;
  (pSVar4->m_switch_statement).m_expression.super_AnalysisInterface._vptr_AnalysisInterface =
       (_func_int **)&PTR_Parse_001721f8;
  (pSVar4->m_switch_statement).m_expression.m_term.super_AnalysisInterface._vptr_AnalysisInterface =
       (_func_int **)&PTR_Parse_00172250;
  (pSVar4->m_switch_statement).m_switch_table.super_AnalysisInterface._vptr_AnalysisInterface =
       (_func_int **)&PTR_Parse_001727d0;
  (pSVar4->m_switch_statement).m_switch_table.m_switch_child_statement.super_AnalysisInterface.
  _vptr_AnalysisInterface = (_func_int **)&PTR_Parse_00172828;
  (pSVar4->m_switch_statement).m_default.super_AnalysisInterface._vptr_AnalysisInterface =
       (_func_int **)&PTR_Parse_00172880;
  (pSVar4->m_switch_statement).m_bottom_label._M_dataplus._M_p =
       (pointer)&(pSVar4->m_switch_statement).m_bottom_label.field_2;
  (pSVar4->m_switch_statement).m_bottom_label._M_string_length = 0;
  (pSVar4->m_switch_statement).m_bottom_label.field_2._M_local_buf[0] = '\0';
  this->m_statement_ptr = pSVar4;
LAB_00130dc4:
  SVar1 = SymbolQueue::GetCurrentName(handle_correct_queue);
  switch(uVar6) {
  case 0:
    uVar6 = 1;
    if (SVar1 != IF_SYM) goto LAB_00130e55;
    break;
  case 1:
    uVar6 = 2;
    if (SVar1 != L_CIRCLE_BRACKET_SYM) goto LAB_00130e55;
    break;
  case 2:
    cVar3 = Condition::Action(&this->m_condition);
    if (cVar3 != 0) {
LAB_00130e55:
      pSVar4 = this->m_statement_ptr;
      if (pSVar4 == (Statement *)0x0) {
        cVar3 = -1;
        goto LAB_00130f0d;
      }
      (pSVar4->super_AnalysisInterface)._vptr_AnalysisInterface = (_func_int **)&PTR_Parse_00172618;
      (pSVar4->m_switch_statement).super_AnalysisInterface._vptr_AnalysisInterface =
           (_func_int **)&PTR_Parse_00172778;
      pcVar5 = (pSVar4->m_switch_statement).m_bottom_label._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar5 != &(pSVar4->m_switch_statement).m_bottom_label.field_2) {
        operator_delete(pcVar5);
      }
      (pSVar4->m_while_loop_statement).super_AnalysisInterface._vptr_AnalysisInterface =
           (_func_int **)&PTR_Parse_00172720;
      pcVar5 = (pSVar4->m_while_loop_statement).m_bottom_label._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar5 != &(pSVar4->m_while_loop_statement).m_bottom_label.field_2) {
        operator_delete(pcVar5);
      }
      pcVar5 = (pSVar4->m_while_loop_statement).m_top_label._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar5 != &(pSVar4->m_while_loop_statement).m_top_label.field_2) {
        operator_delete(pcVar5);
      }
      (pSVar4->m_condition_statement).super_AnalysisInterface._vptr_AnalysisInterface =
           (_func_int **)&PTR_Parse_001726c8;
      pcVar5 = (pSVar4->m_condition_statement).m_bottom_label._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar5 != &(pSVar4->m_condition_statement).m_bottom_label.field_2) {
        operator_delete(pcVar5);
      }
      (pSVar4->m_assign_statement).super_AnalysisInterface._vptr_AnalysisInterface =
           (_func_int **)&PTR_Parse_00172568;
      pcVar5 = (pSVar4->m_assign_statement).m_identifier_name._M_dataplus._M_p;
      cVar3 = -1;
      goto LAB_00130efc;
    }
    Condition::LogOutput(&this->m_condition);
    uVar6 = 3;
    goto LAB_00130dc4;
  case 3:
    uVar6 = 4;
    if (SVar1 != R_CIRCLE_BRACKET_SYM) goto LAB_00130e55;
    break;
  case 4:
    iVar2 = (*(this->m_statement_ptr->super_AnalysisInterface)._vptr_AnalysisInterface[2])();
    if (iVar2 != 0) goto LAB_00130e55;
    (*(this->m_statement_ptr->super_AnalysisInterface)._vptr_AnalysisInterface[1])();
    uVar6 = 5;
    goto LAB_00130dc4;
  case 5:
    goto switchD_00130de1_caseD_5;
  }
  SymbolQueue::NextSymbol(handle_correct_queue);
  goto LAB_00130dc4;
switchD_00130de1_caseD_5:
  pSVar4 = this->m_statement_ptr;
  if (pSVar4 == (Statement *)0x0) {
    cVar3 = 0;
  }
  else {
    (pSVar4->super_AnalysisInterface)._vptr_AnalysisInterface = (_func_int **)&PTR_Parse_00172618;
    (pSVar4->m_switch_statement).super_AnalysisInterface._vptr_AnalysisInterface =
         (_func_int **)&PTR_Parse_00172778;
    pcVar5 = (pSVar4->m_switch_statement).m_bottom_label._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar5 != &(pSVar4->m_switch_statement).m_bottom_label.field_2) {
      operator_delete(pcVar5);
    }
    (pSVar4->m_while_loop_statement).super_AnalysisInterface._vptr_AnalysisInterface =
         (_func_int **)&PTR_Parse_00172720;
    pcVar5 = (pSVar4->m_while_loop_statement).m_bottom_label._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar5 != &(pSVar4->m_while_loop_statement).m_bottom_label.field_2) {
      operator_delete(pcVar5);
    }
    pcVar5 = (pSVar4->m_while_loop_statement).m_top_label._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar5 != &(pSVar4->m_while_loop_statement).m_top_label.field_2) {
      operator_delete(pcVar5);
    }
    (pSVar4->m_condition_statement).super_AnalysisInterface._vptr_AnalysisInterface =
         (_func_int **)&PTR_Parse_001726c8;
    pcVar5 = (pSVar4->m_condition_statement).m_bottom_label._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar5 != &(pSVar4->m_condition_statement).m_bottom_label.field_2) {
      operator_delete(pcVar5);
    }
    (pSVar4->m_assign_statement).super_AnalysisInterface._vptr_AnalysisInterface =
         (_func_int **)&PTR_Parse_00172568;
    pcVar5 = (pSVar4->m_assign_statement).m_identifier_name._M_dataplus._M_p;
    cVar3 = 0;
LAB_00130efc:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar5 != &(pSVar4->m_assign_statement).m_identifier_name.field_2) {
      operator_delete(pcVar5);
    }
  }
LAB_00130f0d:
  operator_delete(pSVar4);
  return cVar3;
}

Assistant:

compile_errcode ConditionStatement::Action() {
    int ret = COMPILE_OK;
    int state = 0;
    m_statement_ptr = new Statement;
    while (true) {
        SymbolName name = handle_correct_queue->GetCurrentName();
        switch (state) {
            case 0: {
                if (name == IF_SYM) {
                    state = 1;
                    break;
                } else {
                    goto ERROR_IF;
                }
            }
            case 1: {
                if (name == L_CIRCLE_BRACKET_SYM) {
                    state = 2;
                    break;
                } else {
                    goto ERROR_IF;
                }
            }
            case 2: {
                if ((ret = m_condition.Action()) == COMPILE_OK) {
                    m_condition.LogOutput();
                    state = 3;
                    break;
                } else {
                    goto ERROR_IF;
                }
            }
            case 3: {
                if (name == R_CIRCLE_BRACKET_SYM) {
                    state = 4;
                    break;
                } else {
                    goto ERROR_IF;
                }
            }
            case 4: {
                if ((ret = m_statement_ptr->Action()) == COMPILE_OK) {
                    m_statement_ptr->LogOutput();
                    state = 5;
                    break;
                } else {
                    goto ERROR_IF;
                }
            }
            case 5: goto CORRECT_IF;
        }
        if (state != 3 && state != 5)
            handle_correct_queue->NextSymbol();
    }
    CORRECT_IF:
        delete(m_statement_ptr);
        return COMPILE_OK;
    ERROR_IF:
        delete(m_statement_ptr);
        return NOT_MATCH;
}